

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

char * read_browser_request(uint32_t *size)

{
  ssize_t sVar1;
  ulong uVar2;
  char *text;
  uint32_t *size_local;
  
  sVar1 = read(0,size,4);
  if (sVar1 < 1) {
    perror("Failed to read request size");
    size_local = (uint32_t *)0x0;
  }
  else {
    size_local = (uint32_t *)malloc((ulong)*size);
    if (size_local == (uint32_t *)0x0) {
      perror("Failed to allocate memory for the text");
    }
    else {
      uVar2 = read(0,size_local,(ulong)*size);
      if (uVar2 != *size) {
        perror("Failed to read request body");
        free(size_local);
        size_local = (uint32_t *)0x0;
      }
    }
  }
  return (char *)size_local;
}

Assistant:

char *
read_browser_request (uint32_t *size)
{
  char *text = NULL;

  /* First 4 bytes is the message type */
  if (read (STDIN_FILENO, (char *) size, 4) <= 0)
    {
      perror ("Failed to read request size");
      return text;
    }

  if (unlikely ((text = malloc (*size)) == NULL))
    {
      perror("Failed to allocate memory for the text");
      return text;
    }

  if (read (STDIN_FILENO, text, *size) != *size)
    {
      perror ("Failed to read request body");
      free (text);
      return NULL;
    }

  return text;
}